

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::Floating::WithinRelMatcher::WithinRelMatcher
          (WithinRelMatcher *this,double target,double epsilon)

{
  ReusableStringStream RStack_48;
  string local_30;
  
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2
  ;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_001a5d48;
  (this->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_001a5d78;
  this->m_target = target;
  this->m_epsilon = epsilon;
  if (epsilon < 0.0) {
    ReusableStringStream::ReusableStringStream(&RStack_48);
    std::operator<<((ostream *)RStack_48.m_oss,
                    "Relative comparison with epsilon <  0 does not make sense.");
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_30);
  }
  if (epsilon < 1.0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&RStack_48);
  std::operator<<((ostream *)RStack_48.m_oss,
                  "Relative comparison with epsilon >= 1 does not make sense.");
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_30);
}

Assistant:

WithinRelMatcher::WithinRelMatcher(double target, double epsilon):
        m_target(target),
        m_epsilon(epsilon){
        CATCH_ENFORCE(m_epsilon >= 0., "Relative comparison with epsilon <  0 does not make sense.");
        CATCH_ENFORCE(m_epsilon  < 1., "Relative comparison with epsilon >= 1 does not make sense.");
    }